

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<112,Blob<224>>
               (hashfunc<Blob<224>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  uint uVar1;
  bool bVar2;
  pfHash p_Var3;
  reference pvVar4;
  size_type sVar5;
  uint in_EDX;
  char *pcVar6;
  uint in_ESI;
  bool result;
  keytype k;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  bool in_stack_0000009b;
  bool in_stack_0000009c;
  bool in_stack_0000009d;
  bool in_stack_0000009e;
  bool in_stack_0000009f;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_000000a0;
  undefined4 in_stack_ffffffffffffffb8;
  byte bVar7;
  undefined4 in_stack_ffffffffffffffbc;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffffc0;
  Blob<112> *in_stack_ffffffffffffffc8;
  uint8_t in_stack_ffffffffffffffd7;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  pointer in_stack_ffffffffffffffe0;
  hashfunc local_8 [8];
  
  uVar1 = in_EDX & 1;
  pcVar6 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar6 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x70,pcVar6,(ulong)in_ESI);
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)0x1866f1);
  Blob<112>::Blob((Blob<112> *)&stack0xffffffffffffffca);
  memset(&stack0xffffffffffffffca,0,0xe);
  if (uVar1 != 0) {
    std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::resize
              (in_stack_ffffffffffffffc0,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    p_Var3 = hashfunc::operator_cast_to_function_pointer(local_8);
    pvVar4 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[]
                       ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)&stack0xffffffffffffffd8,0
                       );
    (*p_Var3)(&stack0xffffffffffffffca,0xe,0,pvVar4);
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<112>,Blob<224>>
            ((pfHash)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
             (bool)in_stack_ffffffffffffffd7,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  sVar5 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size
                    ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)&stack0xffffffffffffffd8);
  printf("%d keys\n",sVar5 & 0xffffffff);
  bVar7 = 1;
  bVar2 = TestHashList<Blob<224>>
                    (in_stack_000000a0,in_stack_0000009f,in_stack_0000009e,in_stack_0000009d,
                     in_stack_0000009c,in_stack_0000009b);
  bVar7 = bVar2 & bVar7;
  printf("\n");
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)CONCAT44(in_ESI,in_EDX));
  return (bool)(bVar7 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}